

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

int nn_sinproc_send(nn_pipebase *self,nn_msg *msg)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  void **local_90;
  undefined1 local_88 [8];
  nn_msg nmsg;
  nn_sinproc *sinproc;
  nn_msg *msg_local;
  nn_pipebase *self_local;
  
  if (self == (nn_pipebase *)0x0) {
    local_90 = (void **)0x0;
  }
  else {
    local_90 = &self[-1].data;
  }
  nmsg.body.u._24_8_ = local_90;
  if (((nn_ep_options *)(local_90 + 0xb))->sndprio == 5) {
    self_local._4_4_ = -0x68;
  }
  else {
    if (((nn_ep_options *)(local_90 + 0xb))->sndprio != 4) {
      fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",
              (ulong)(uint)((nn_ep_options *)(local_90 + 0xb))->sndprio,"NN_SINPROC_STATE_ACTIVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
              ,0x96);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((*(int *)((long)local_90 + 0x5c) & 1U) != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!(sinproc->flags & NN_SINPROC_FLAG_SENDING)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
              ,0x97);
      fflush(_stderr);
      nn_err_abort();
    }
    sVar1 = nn_chunkref_size(&msg->sphdr);
    sVar2 = nn_chunkref_size(&msg->body);
    nn_msg_init((nn_msg *)local_88,sVar1 + sVar2);
    pvVar3 = nn_chunkref_data((nn_chunkref *)((long)&nmsg.hdrs.u + 0x18));
    pvVar4 = nn_chunkref_data(&msg->sphdr);
    sVar1 = nn_chunkref_size(&msg->sphdr);
    memcpy(pvVar3,pvVar4,sVar1);
    pvVar3 = nn_chunkref_data((nn_chunkref *)((long)&nmsg.hdrs.u + 0x18));
    sVar1 = nn_chunkref_size(&msg->sphdr);
    pvVar4 = nn_chunkref_data(&msg->body);
    sVar2 = nn_chunkref_size(&msg->body);
    memcpy((void *)((long)pvVar3 + sVar1),pvVar4,sVar2);
    nn_msg_term(msg);
    nn_msg_term((nn_msg *)(nmsg.body.u._24_8_ + 0x180));
    nn_msg_mv((nn_msg *)(nmsg.body.u._24_8_ + 0x180),(nn_msg *)local_88);
    *(uint *)(nmsg.body.u._24_8_ + 0x5c) = *(uint *)(nmsg.body.u._24_8_ + 0x5c) | 1;
    nn_fsm_raiseto((nn_fsm *)nmsg.body.u._24_8_,*(nn_fsm **)(nmsg.body.u._24_8_ + 0x60),
                   (nn_fsm_event *)(*(long *)(nmsg.body.u._24_8_ + 0x60) + 0x208),0x6c41,4,
                   (void *)nmsg.body.u._24_8_);
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_sinproc_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sinproc *sinproc;
    struct nn_msg nmsg;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  If the peer have already closed the connection, we cannot send
        anymore. */
    if (sinproc->state == NN_SINPROC_STATE_DISCONNECTED)
        return -ECONNRESET;

    /*  Sanity checks. */
    nn_assert_state (sinproc, NN_SINPROC_STATE_ACTIVE);
    nn_assert (!(sinproc->flags & NN_SINPROC_FLAG_SENDING));

    nn_msg_init (&nmsg,
        nn_chunkref_size (&msg->sphdr) +
        nn_chunkref_size (&msg->body));
    memcpy (nn_chunkref_data (&nmsg.body),
        nn_chunkref_data (&msg->sphdr),
        nn_chunkref_size (&msg->sphdr));
    memcpy ((char *)nn_chunkref_data (&nmsg.body) +
        nn_chunkref_size (&msg->sphdr),
        nn_chunkref_data (&msg->body),
        nn_chunkref_size (&msg->body));
    nn_msg_term (msg);

    /*  Expose the message to the peer. */
    nn_msg_term (&sinproc->msg);
    nn_msg_mv (&sinproc->msg, &nmsg);

    /*  Notify the peer that there's a message to get. */
    sinproc->flags |= NN_SINPROC_FLAG_SENDING;
    nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
        &sinproc->peer->event_sent, NN_SINPROC_SRC_PEER,
        NN_SINPROC_SENT, sinproc);

    return 0;
}